

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_Execute(cmsysProcess *cp)

{
  int *p_00;
  cmsysProcess **__src;
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  long lVar4;
  pid_t *ppVar5;
  int *piVar6;
  char *pcVar7;
  cmsysProcess **__dest;
  int *piVar8;
  ssize_t sVar9;
  size_t __n;
  kwsysProcess_ssize_t n;
  ulong uVar10;
  bool bVar11;
  kwsysProcessTime kVar12;
  int nextStdIn;
  kwsysProcessInstances local_478;
  int aiStack_468 [2];
  int *local_460;
  int *local_458;
  ulong local_450;
  int *local_448;
  int local_43c;
  int p [2];
  undefined1 local_430 [128];
  int local_3b0;
  
  if (cp == (cmsysProcess *)0x0) {
    return;
  }
  if (cp->State == 3) {
    return;
  }
  if (cp->NumberOfCommands < 1) {
    builtin_strncpy(cp->ErrorMessage,"No command",0xb);
    goto LAB_00134ea8;
  }
  for (lVar4 = 3; lVar4 != 6; lVar4 = lVar4 + 1) {
    cp->PipeReadEnds[lVar4 + -3] = -1;
  }
  piVar8 = cp->PipeChildStd;
  for (lVar4 = 6; lVar4 != 9; lVar4 = lVar4 + 1) {
    cp->PipeReadEnds[lVar4 + -3] = -1;
  }
  cp->SignalPipe = -1;
  cp->SelectError = 0;
  *(undefined4 *)&(cp->StartTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->StartTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_usec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
  cp->TimeoutExpired = 0;
  cp->PipesLeft = 0;
  cp->CommandsLeft = 0;
  for (lVar4 = 0x90; lVar4 != 0xa0; lVar4 = lVar4 + 1) {
    (cp->PipeReadEnds + lVar4 * 2 + -3)[0] = 0;
    (cp->PipeReadEnds + lVar4 * 2 + -3)[1] = 0;
  }
  cp->Killed = 0;
  cp->State = 0;
  cp->ExitException = 0;
  cp->ExitCode = 1;
  cp->ExitValue = 1;
  cp->ErrorMessage[0] = '\0';
  builtin_strncpy(cp->ExitExceptionString,"No exception",0xd);
  free(cp->ForkPIDs);
  ppVar5 = (pid_t *)calloc(1,(long)cp->NumberOfCommands << 2);
  cp->ForkPIDs = ppVar5;
  if (ppVar5 != (pid_t *)0x0) {
    free(cp->CommandExitCodes);
    piVar6 = (int *)calloc(1,(long)cp->NumberOfCommands << 2);
    cp->CommandExitCodes = piVar6;
    if (piVar6 != (int *)0x0) {
      if (cp->WorkingDirectory == (char *)0x0) {
LAB_00134ec4:
        if (cp->OptionDetach == 0) {
          iVar1 = pipe(p);
          if (iVar1 < 0) goto LAB_00135545;
          cp->PipeReadEnds[2] = p[0];
          cp->SignalPipe = p[1];
          iVar1 = kwsysProcessSetNonBlocking(p[0]);
          if (iVar1 == 0) goto LAB_00135545;
          iVar1 = kwsysProcessSetNonBlocking(p[1]);
          if ((iVar1 == 0) || (iVar1 = fcntl64((ulong)p & 0xffffffff,2,1), iVar1 < 0))
          goto LAB_00135545;
          iVar2 = fcntl64(p[1],2,1);
          __src = kwsysProcesses.Processes;
          iVar1 = kwsysProcesses.Count;
          if (iVar2 < 0) goto LAB_00135545;
          lVar4 = (long)kwsysProcesses.Count;
          local_478.Size = kwsysProcesses.Size;
          local_478.Processes = kwsysProcesses.Processes;
          __dest = kwsysProcesses.Processes;
          if (kwsysProcesses.Count == kwsysProcesses.Size) {
            local_478.Size = kwsysProcesses.Count * 2;
            if (kwsysProcesses.Count == 0) {
              local_478.Size = 4;
            }
            __dest = (cmsysProcess **)malloc((long)local_478.Size << 3);
            local_478.Processes = __dest;
            if (__dest == (cmsysProcess **)0x0) goto LAB_00135545;
            if (0 < iVar1) {
              memcpy(__dest,__src,lVar4 * 8);
            }
          }
          local_478.Count = iVar1 + 1;
          __dest[lVar4] = cp;
          kwsysProcessesUpdate(&local_478);
          if (__dest != __src) {
            free(__src);
          }
          if (iVar1 == 0) {
            memset(local_430,0,0x90);
            p = (int  [2])kwsysProcessesSignalHandler;
            local_3b0 = 0x10000005;
            do {
              iVar1 = sigaction(0x11,(sigaction *)p,(sigaction *)&kwsysProcessesOldSigChldAction);
              if (-1 < iVar1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
          }
        }
        if (cp->PipeFileSTDIN == (char *)0x0) {
          iVar1 = 0;
          if (cp->PipeSharedSTDIN == 0) {
            iVar1 = cp->PipeNativeSTDIN[0];
            if (-1 < iVar1) {
              *piVar8 = iVar1;
              iVar1 = fcntl64(iVar1,2,1);
              if (iVar1 < 0) goto LAB_00135545;
              iVar1 = cp->PipeNativeSTDIN[1];
              goto LAB_00134ef9;
            }
            iVar1 = -1;
          }
          *piVar8 = iVar1;
        }
        else {
          iVar1 = open64(cp->PipeFileSTDIN,0);
          *piVar8 = iVar1;
          if (iVar1 < 0) goto LAB_00135545;
LAB_00134ef9:
          iVar1 = fcntl64(iVar1,2,1);
          if (iVar1 < 0) goto LAB_00135545;
        }
        iVar1 = pipe(p);
        if (iVar1 < 0) goto LAB_00135545;
        cp->PipeReadEnds[0] = p[0];
        cp->PipeChildStd[1] = p[1];
        iVar1 = fcntl64((ulong)p & 0xffffffff,2,1);
        if (iVar1 < 0) goto LAB_00135545;
        iVar1 = fcntl64(p[1],2,1);
        if (iVar1 < 0) goto LAB_00135545;
        iVar1 = kwsysProcessSetNonBlocking(p[0]);
        if (iVar1 == 0) goto LAB_00135545;
        piVar6 = cp->PipeChildStd + 1;
        if (cp->PipeFileSTDOUT == (char *)0x0) {
          if (cp->PipeSharedSTDOUT == 0) {
            if (-1 < cp->PipeNativeSTDOUT[1]) {
              iVar1 = kwsysProcessSetupOutputPipeNative(piVar6,cp->PipeNativeSTDOUT);
              goto LAB_001350f8;
            }
          }
          else {
            kwsysProcessCleanupDescriptor(piVar6);
            *piVar6 = 1;
          }
        }
        else {
          iVar1 = kwsysProcessSetupOutputPipeFile(piVar6,cp->PipeFileSTDOUT);
LAB_001350f8:
          if (iVar1 == 0) goto LAB_00135545;
        }
        iVar1 = pipe(p);
        if (-1 < iVar1) {
          cp->PipeReadEnds[1] = p[0];
          cp->PipeChildStd[2] = p[1];
          iVar1 = fcntl64((ulong)p & 0xffffffff,2,1);
          if (iVar1 < 0) goto LAB_00135545;
          iVar1 = fcntl64(p[1],2,1);
          if (iVar1 < 0) goto LAB_00135545;
          iVar1 = kwsysProcessSetNonBlocking(p[0]);
          if (iVar1 == 0) goto LAB_00135545;
          p_00 = cp->PipeChildStd + 2;
          local_458 = p_00;
          if (cp->PipeFileSTDERR == (char *)0x0) {
            if (cp->PipeSharedSTDERR != 0) {
              kwsysProcessCleanupDescriptor(p_00);
              *p_00 = 2;
              goto LAB_0013521c;
            }
            if (cp->PipeNativeSTDERR[1] < 0) goto LAB_0013521c;
            iVar1 = kwsysProcessSetupOutputPipeNative(p_00,cp->PipeNativeSTDERR);
          }
          else {
            iVar1 = kwsysProcessSetupOutputPipeFile(p_00,cp->PipeFileSTDERR);
          }
          if (iVar1 != 0) {
LAB_0013521c:
            kVar12 = kwsysProcessTimeGetCurrent();
            cp->StartTime = kVar12;
            *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
            *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
            *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
            *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
            local_478.Size = -1;
            local_478.Processes = (cmsysProcess **)0xffffffffffffffff;
            aiStack_468[0] = -1;
            nextStdIn = cp->PipeChildStd[0];
            uVar10 = 0;
            local_460 = piVar8;
            local_448 = piVar6;
            while ((long)uVar10 < (long)cp->NumberOfCommands) {
              local_478.Count = nextStdIn;
              if (uVar10 != cp->NumberOfCommands - 1) {
                p[0] = -1;
                p[1] = -1;
                iVar1 = pipe(p);
                if (-1 < iVar1) {
                  iVar1 = fcntl64((ulong)p & 0xffffffff,2,1);
                  if (-1 < iVar1) {
                    iVar1 = fcntl64(p[1],2,1);
                    if (-1 < iVar1) {
                      nextStdIn = p[0];
                      local_478.Size = p[1];
                      goto LAB_001352e6;
                    }
                  }
                  close(p[0]);
                  close(p[1]);
                }
                goto LAB_00135532;
              }
              nextStdIn = -1;
              local_478.Size = *piVar6;
LAB_001352e6:
              local_478.Processes =
                   (cmsysProcess **)
                   CONCAT44(local_478.Processes._4_4_,
                            cp->PipeChildStd[(ulong)(cp->MergeOutput == 0) + 1]);
              iVar1 = pipe((int *)((long)&local_478.Processes + 4));
              bVar11 = true;
              if ((-1 < iVar1) && (iVar1 = fcntl64(aiStack_468[0],2,1), -1 < iVar1)) {
                iVar1 = cp->OptionDetach;
                iVar2 = fork();
                piVar8 = local_460;
                if (-1 < iVar2 && iVar1 != 0) {
                  if (iVar2 == 0) {
                    _Var3 = fork();
                    p[0] = _Var3;
                    if (_Var3 == 0) {
                      cp->ForkPIDs[uVar10] = 0;
                      goto LAB_00135595;
                    }
                    goto LAB_00135824;
                  }
                  do {
                    sVar9 = read(local_478.Processes._4_4_,p,4);
                    if (-1 < sVar9) break;
                    piVar6 = __errno_location();
                  } while (*piVar6 == 4);
                  do {
                    _Var3 = waitpid(iVar2,&local_43c,0);
                    if (-1 < _Var3) break;
                    piVar6 = __errno_location();
                  } while (*piVar6 == 4);
                  iVar2 = p[0];
                }
                cp->ForkPIDs[uVar10] = iVar2;
                lVar4 = 1;
                if (-1 < iVar2) {
                  if (iVar2 == 0) {
LAB_00135595:
                    close(local_478.Processes._4_4_);
                    if (local_478.Count < 1) {
                      if (local_478.Count < 0) {
                        close(0);
                      }
                    }
                    else {
                      dup2(local_478.Count,0);
                    }
                    if (local_478.Size != 1) {
                      dup2(local_478.Size,1);
                    }
                    if ((int)local_478.Processes != 2) {
                      dup2((int)local_478.Processes,2);
                    }
                    fcntl64(0,2,0);
                    fcntl64(1,2,0);
                    fcntl64(2,2,0);
                    memset((sigaction *)p,0,0x98);
                    sigaction(1,(sigaction *)p,(sigaction *)0x0);
                    sigaction(2,(sigaction *)p,(sigaction *)0x0);
                    sigaction(3,(sigaction *)p,(sigaction *)0x0);
                    sigaction(4,(sigaction *)p,(sigaction *)0x0);
                    sigaction(5,(sigaction *)p,(sigaction *)0x0);
                    sigaction(6,(sigaction *)p,(sigaction *)0x0);
                    sigaction(6,(sigaction *)p,(sigaction *)0x0);
                    sigaction(7,(sigaction *)p,(sigaction *)0x0);
                    sigaction(8,(sigaction *)p,(sigaction *)0x0);
                    sigaction(10,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0xb,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0xc,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0xd,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0xe,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0xf,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x10,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x11,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x11,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x12,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x14,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x15,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x16,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x17,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x18,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x19,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x1a,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x1b,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x1c,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x1d,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x1d,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x1e,(sigaction *)p,(sigaction *)0x0);
                    sigaction(0x1f,(sigaction *)p,(sigaction *)0x0);
                    execvp(*cp->Commands[uVar10],cp->Commands[uVar10]);
                    iVar1 = aiStack_468[0];
                    piVar8 = __errno_location();
                    pcVar7 = strerror(*piVar8);
                    strncpy((char *)p,pcVar7,0x400);
                    __n = strlen((char *)p);
                    write(iVar1,p,__n);
                    _exit(1);
                  }
                  cp->CommandsLeft = cp->CommandsLeft + 1;
                  local_450 = uVar10;
                  kwsysProcessCleanupDescriptor(aiStack_468);
                  uVar10 = 0;
                  while ((uVar10 < 0x400 && (0 < lVar4))) {
                    do {
                      lVar4 = read(local_478.Processes._4_4_,cp->ErrorMessage + uVar10,
                                   0x400 - uVar10);
                      if (-1 < lVar4) break;
                      piVar8 = __errno_location();
                    } while (*piVar8 == 4);
                    sVar9 = lVar4;
                    if (lVar4 < 1) {
                      sVar9 = 0;
                    }
                    uVar10 = uVar10 + sVar9;
                  }
                  kwsysProcessCleanupDescriptor((int *)((long)&local_478.Processes + 4));
                  bVar11 = uVar10 != 0;
                  uVar10 = local_450;
                  piVar8 = local_460;
                }
              }
              if (local_478.Count != *piVar8) {
                kwsysProcessCleanupDescriptor(&local_478.Count);
              }
              piVar6 = local_448;
              if (local_478.Size != *local_448) {
                kwsysProcessCleanupDescriptor(&local_478.Size);
              }
              if (((int)local_478.Processes != *local_458) && (cp->MergeOutput == 0)) {
                kwsysProcessCleanupDescriptor((int *)&local_478.Processes);
              }
              uVar10 = uVar10 + 1;
              if (bVar11) goto code_r0x00135497;
            }
            for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
              kwsysProcessCleanupDescriptor((int *)((long)piVar8 + lVar4));
            }
            if (cp->RealWorkingDirectory != (char *)0x0) {
              do {
                iVar1 = chdir(cp->RealWorkingDirectory);
                if (-1 < iVar1) break;
                piVar8 = __errno_location();
              } while (*piVar8 == 4);
              free(cp->RealWorkingDirectory);
              cp->RealWorkingDirectory = (char *)0x0;
            }
            cp->PipesLeft = 3;
            cp->State = 3;
            cp->Detached = cp->OptionDetach;
            return;
          }
        }
LAB_00135545:
        kwsysProcessCleanup(cp,1);
        return;
      }
      cp->RealWorkingDirectoryLength = 0x1000;
      pcVar7 = (char *)malloc(0x1000);
      cp->RealWorkingDirectory = pcVar7;
      if (pcVar7 != (char *)0x0) {
        pcVar7 = getcwd(cp->RealWorkingDirectory,(long)cp->RealWorkingDirectoryLength);
        if (pcVar7 != (char *)0x0) {
          do {
            iVar1 = chdir(cp->WorkingDirectory);
            if (-1 < iVar1) goto LAB_00134ec4;
            piVar6 = __errno_location();
          } while (*piVar6 == 4);
        }
        kwsysProcessCleanup(cp,1);
        return;
      }
    }
  }
  builtin_strncpy(cp->ErrorMessage,"Out of memory",0xe);
LAB_00134ea8:
  cp->State = 1;
  return;
code_r0x00135497:
  kwsysProcessCleanupDescriptor((int *)((long)&local_478.Processes + 4));
  kwsysProcessCleanupDescriptor(aiStack_468);
LAB_00135532:
  if (nextStdIn != *piVar8) {
    kwsysProcessCleanupDescriptor(&nextStdIn);
  }
  goto LAB_00135545;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_00135824:
    sVar9 = write(aiStack_468[0],p,4);
    if (-1 < sVar9) break;
  }
  _exit(0);
}

Assistant:

void kwsysProcess_Execute(kwsysProcess* cp)
{
  int i;

  /* Do not execute a second copy simultaneously.  */
  if(!cp || cp->State == kwsysProcess_State_Executing)
    {
    return;
    }

  /* Make sure we have something to run.  */
  if(cp->NumberOfCommands < 1)
    {
    strcpy(cp->ErrorMessage, "No command");
    cp->State = kwsysProcess_State_Error;
    return;
    }

  /* Initialize the control structure for a new process.  */
  if(!kwsysProcessInitialize(cp))
    {
    strcpy(cp->ErrorMessage, "Out of memory");
    cp->State = kwsysProcess_State_Error;
    return;
    }

#if defined(__VMS)
  /* Make sure pipes behave like streams on VMS.  */
  if(!kwsysProcessSetVMSFeature("DECC$STREAM_PIPE", 1))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }
#endif

  /* Save the real working directory of this process and change to
     the working directory for the child processes.  This is needed
     to make pipe file paths evaluate correctly.  */
  if(cp->WorkingDirectory)
    {
    int r;
    if(!getcwd(cp->RealWorkingDirectory,
               (size_t)(cp->RealWorkingDirectoryLength)))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }

    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while(((r = chdir(cp->WorkingDirectory)) < 0) && (errno == EINTR));
    if(r < 0)
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* If not running a detached child, add this object to the global
     set of process objects that wish to be notified when a child
     exits.  */
  if(!cp->OptionDetach)
    {
    if(!kwsysProcessesAdd(cp))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* Setup the stdin pipe for the first process.  */
  if(cp->PipeFileSTDIN)
    {
    /* Open a file for the child's stdin to read.  */
    cp->PipeChildStd[0] = open(cp->PipeFileSTDIN, O_RDONLY);
    if(cp->PipeChildStd[0] < 0)
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }

    /* Set close-on-exec flag on the pipe's end.  */
    if(fcntl(cp->PipeChildStd[0], F_SETFD, FD_CLOEXEC) < 0)
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else if(cp->PipeSharedSTDIN)
    {
    cp->PipeChildStd[0] = 0;
    }
  else if(cp->PipeNativeSTDIN[0] >= 0)
    {
    cp->PipeChildStd[0] = cp->PipeNativeSTDIN[0];

    /* Set close-on-exec flag on the pipe's ends.  The read end will
       be dup2-ed into the stdin descriptor after the fork but before
       the exec.  */
    if((fcntl(cp->PipeNativeSTDIN[0], F_SETFD, FD_CLOEXEC) < 0) ||
       (fcntl(cp->PipeNativeSTDIN[1], F_SETFD, FD_CLOEXEC) < 0))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else
    {
    cp->PipeChildStd[0] = -1;
    }

  /* Create the output pipe for the last process.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
  /* Create the pipe.  */
  int p[2];
  if(pipe(p KWSYSPE_VMS_NONBLOCK) < 0)
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Store the pipe.  */
  cp->PipeReadEnds[KWSYSPE_PIPE_STDOUT] = p[0];
  cp->PipeChildStd[1] = p[1];

  /* Set close-on-exec flag on the pipe's ends.  */
  if((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
     (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Set to non-blocking in case select lies, or for the polling
     implementation.  */
  if(!kwsysProcessSetNonBlocking(p[0]))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }
  }

  if (cp->PipeFileSTDOUT)
    {
    /* Use a file for stdout.  */
    if(!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[1],
                                        cp->PipeFileSTDOUT))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else if (cp->PipeSharedSTDOUT)
    {
    /* Use the parent stdout.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[1]);
    cp->PipeChildStd[1] = 1;
    }
  else if (cp->PipeNativeSTDOUT[1] >= 0)
    {
    /* Use the given descriptor for stdout.  */
    if(!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[1],
                                          cp->PipeNativeSTDOUT))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* Create stderr pipe to be shared by all processes in the pipeline.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
  /* Create the pipe.  */
  int p[2];
  if(pipe(p KWSYSPE_VMS_NONBLOCK) < 0)
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Store the pipe.  */
  cp->PipeReadEnds[KWSYSPE_PIPE_STDERR] = p[0];
  cp->PipeChildStd[2] = p[1];

  /* Set close-on-exec flag on the pipe's ends.  */
  if((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
     (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Set to non-blocking in case select lies, or for the polling
     implementation.  */
  if(!kwsysProcessSetNonBlocking(p[0]))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }
  }

  if (cp->PipeFileSTDERR)
    {
    /* Use a file for stderr.  */
    if(!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[2],
                                        cp->PipeFileSTDERR))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else if (cp->PipeSharedSTDERR)
    {
    /* Use the parent stderr.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[2]);
    cp->PipeChildStd[2] = 2;
    }
  else if (cp->PipeNativeSTDERR[1] >= 0)
    {
    /* Use the given handle for stderr.  */
    if(!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[2],
                                          cp->PipeNativeSTDERR))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* The timeout period starts now.  */
  cp->StartTime = kwsysProcessTimeGetCurrent();
  cp->TimeoutTime.tv_sec = -1;
  cp->TimeoutTime.tv_usec = -1;

  /* Create the pipeline of processes.  */
  {
  kwsysProcessCreateInformation si = {-1, -1, -1, {-1, -1}};
  int nextStdIn = cp->PipeChildStd[0];
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    /* Setup the process's pipes.  */
    si.StdIn = nextStdIn;
    if (i == cp->NumberOfCommands-1)
      {
      nextStdIn = -1;
      si.StdOut = cp->PipeChildStd[1];
      }
    else
      {
      /* Create a pipe to sit between the children.  */
      int p[2] = {-1,-1};
      if(pipe(p KWSYSPE_VMS_NONBLOCK) < 0)
        {
        if (nextStdIn != cp->PipeChildStd[0])
          {
          kwsysProcessCleanupDescriptor(&nextStdIn);
          }
        kwsysProcessCleanup(cp, 1);
        return;
        }

      /* Set close-on-exec flag on the pipe's ends.  */
      if((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
         (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0))
        {
        close(p[0]);
        close(p[1]);
        if (nextStdIn != cp->PipeChildStd[0])
          {
          kwsysProcessCleanupDescriptor(&nextStdIn);
          }
        kwsysProcessCleanup(cp, 1);
        return;
        }
      nextStdIn = p[0];
      si.StdOut = p[1];
      }
    si.StdErr = cp->MergeOutput? cp->PipeChildStd[1] : cp->PipeChildStd[2];

    {
    int res = kwsysProcessCreate(cp, i, &si);

    /* Close our copies of pipes used between children.  */
    if (si.StdIn != cp->PipeChildStd[0])
      {
      kwsysProcessCleanupDescriptor(&si.StdIn);
      }
    if (si.StdOut != cp->PipeChildStd[1])
      {
      kwsysProcessCleanupDescriptor(&si.StdOut);
      }
    if (si.StdErr != cp->PipeChildStd[2] && !cp->MergeOutput)
      {
      kwsysProcessCleanupDescriptor(&si.StdErr);
      }

    if(!res)
      {
      kwsysProcessCleanupDescriptor(&si.ErrorPipe[0]);
      kwsysProcessCleanupDescriptor(&si.ErrorPipe[1]);
      if (nextStdIn != cp->PipeChildStd[0])
        {
        kwsysProcessCleanupDescriptor(&nextStdIn);
        }
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
    }
  }

  /* The parent process does not need the child's pipe ends.  */
  for (i=0; i < 3; ++i)
    {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
    }

  /* Restore the working directory. */
  if(cp->RealWorkingDirectory)
    {
    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR));
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
    }

  /* All the pipes are now open.  */
  cp->PipesLeft = KWSYSPE_PIPE_COUNT;

  /* The process has now started.  */
  cp->State = kwsysProcess_State_Executing;
  cp->Detached = cp->OptionDetach;
}